

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O3

char * findfile(lua_State *L,char *name,char *pname)

{
  char *pcVar1;
  
  lua_getfield(L,-0x2711,pname);
  pcVar1 = lua_tolstring(L,-1,(size_t *)0x0);
  if (pcVar1 != (char *)0x0) {
    pcVar1 = searchpath(L,name,pcVar1,".","/");
    return pcVar1;
  }
  luaL_error(L,"\'package.%s\' must be a string",pname);
}

Assistant:

static const char *findfile(lua_State *L, const char *name,
			    const char *pname)
{
  const char *path;
  lua_getfield(L, LUA_ENVIRONINDEX, pname);
  path = lua_tostring(L, -1);
  if (path == NULL)
    luaL_error(L, LUA_QL("package.%s") " must be a string", pname);
  return searchpath(L, name, path, ".", LUA_DIRSEP);
}